

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::LookupAny
          (PersistentStorageJson *this,Registrar *aValue,
          vector<ot::commissioner::persistent_storage::Registrar,_std::allocator<ot::commissioner::persistent_storage::Registrar>_>
          *aRet)

{
  pointer pcVar1;
  undefined8 uVar2;
  code *pcVar3;
  Status SVar4;
  _func_void *p_Var5;
  _func_bool__Any_data_ptr_Registrar_ptr *__tmp_2;
  function<bool_(const_ot::commissioner::persistent_storage::Registrar_&)> pred;
  _Any_data __tmp;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  _Any_data local_d0;
  code *local_c0;
  string local_b0;
  uint local_90;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  uint local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60 [2];
  
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<bool_(const_ot::commissioner::persistent_storage::Registrar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:434:51)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<bool_(const_ot::commissioner::persistent_storage::Registrar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:434:51)>
              ::_M_manager;
  local_90 = (aValue->mId).mId;
  local_88 = local_78;
  pcVar1 = (aValue->mAddr)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + (aValue->mAddr)._M_string_length);
  local_68 = aValue->mPort;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_60,&aValue->mDomains);
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  p_Var5 = (_func_void *)operator_new(0x48);
  *(uint *)p_Var5 = local_90;
  *(_func_void **)(p_Var5 + 8) = p_Var5 + 0x18;
  std::__cxx11::string::_M_construct<char*>((string *)(p_Var5 + 8),local_88,local_88 + local_80);
  *(uint *)(p_Var5 + 0x28) = local_68;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(p_Var5 + 0x30),local_60);
  pcVar3 = local_108;
  local_f8._M_unused._M_object = local_118._M_unused._M_object;
  uVar2 = local_118._8_8_;
  local_118._8_8_ = local_f8._8_8_;
  local_e8 = local_108;
  local_108 = std::
              _Function_handler<bool_(const_ot::commissioner::persistent_storage::Registrar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:436:12)>
              ::_M_manager;
  pcStack_e0 = local_100;
  local_100 = std::
              _Function_handler<bool_(const_ot::commissioner::persistent_storage::Registrar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:436:12)>
              ::_M_invoke;
  local_118._M_unused._M_function_pointer = p_Var5;
  local_f8._8_8_ = uVar2;
  if (pcVar3 != (code *)0x0) {
    (*pcVar3)(&local_f8,&local_f8,__destroy_functor);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_60);
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::function<bool_(const_ot::commissioner::persistent_storage::Registrar_&)>::function
            ((function<bool_(const_ot::commissioner::persistent_storage::Registrar_&)> *)&local_d0,
             (function<bool_(const_ot::commissioner::persistent_storage::Registrar_&)> *)&local_118)
  ;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,JSON_RGR_abi_cxx11_,DAT_002e9808 + JSON_RGR_abi_cxx11_);
  SVar4 = LookupPred<ot::commissioner::persistent_storage::Registrar>
                    (this,(function<bool_(const_ot::commissioner::persistent_storage::Registrar_&)>
                           *)&local_d0,aRet,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_c0 != (code *)0x0) {
    (*local_c0)(&local_d0,&local_d0,__destroy_functor);
  }
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,__destroy_functor);
  }
  return SVar4;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::LookupAny(Registrar const &aValue, std::vector<Registrar> &aRet)
{
    std::function<bool(Registrar const &)> pred = [](Registrar const &) { return true; };

    pred = [aValue](Registrar const &el) {
        bool aRet = (aValue.mId.mId == EMPTY_ID || (el.mId.mId == aValue.mId.mId)) ||
                    (aValue.mAddr.empty() || CaseInsensitiveEqual(aValue.mAddr, el.mAddr)) ||
                    (aValue.mPort == 0 || (aValue.mPort == el.mPort));

        if (!aValue.mDomains.empty())
        {
            std::vector<std::string> tmpElement(el.mDomains);
            std::vector<std::string> tmpValue(aValue.mDomains);
            std::sort(std::begin(tmpElement), std::end(tmpElement));
            std::sort(std::begin(tmpValue), std::end(tmpValue));
            aRet = aRet || std::includes(std::begin(tmpElement), std::end(tmpElement), std::begin(tmpValue),
                                         std::end(tmpValue));
        }
        return aRet;
    };

    return LookupPred<Registrar>(pred, aRet, JSON_RGR);
}